

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe_method.cpp
# Opt level: O2

ostream * operator<<(ostream *out,RNG *rng)

{
  ostream *poVar1;
  Mark local_e0;
  Mark local_a0;
  Mark local_60;
  
  poVar1 = std::operator<<(out,"Generated ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," numbers:\n");
  poVar1 = std::operator<<(poVar1,"Total time = ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"ns\n");
  poVar1 = std::operator<<(poVar1,"Average time = ");
  bm::Mark::average(&local_60,&rng->_generate_mark);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"ns\n");
  poVar1 = std::operator<<(poVar1,"Max time = ");
  bm::Mark::Mark<long,std::ratio<1l,1000000000l>>(&local_a0,&(rng->_generate_mark)._max);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1,"ns\n");
  poVar1 = std::operator<<(poVar1,"Min time = ");
  bm::Mark::Mark<long,std::ratio<1l,1000000000l>>
            (&local_e0,(duration<long,_std::ratio<1L,_1000000000L>_> *)rng);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1,"ns\n");
  std::_Function_base::~_Function_base(&local_e0._overflow_callback.super__Function_base);
  std::_Function_base::~_Function_base(&local_a0._overflow_callback.super__Function_base);
  std::_Function_base::~_Function_base(&local_60._overflow_callback.super__Function_base);
  return out;
}

Assistant:

inline std::ostream& operator<<(std::ostream& out, RNG& rng)
{
    out << "Generated " << rng._generate_mark.iterations() << " numbers:\n"
        << "Total time = " << rng._generate_mark.as_nanoseconds() << "ns\n"
        << "Average time = " << rng._generate_mark.average().as_nanoseconds() << "ns\n"
        << "Max time = " << rng._generate_mark.maximal().as_nanoseconds() << "ns\n"
        << "Min time = " << rng._generate_mark.minimal().as_nanoseconds() << "ns\n";
    return out;
}